

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

RegNum __thiscall
LinearScan::SpillLiveRange(LinearScan *this,Lifetime *spilledRange,Instr *insertionInstr)

{
  RegNum reg;
  uint32 uVar1;
  uint uVar2;
  uint32 uVar3;
  StackSym *this_00;
  code *pcVar4;
  bool bVar5;
  ushort uVar6;
  uint uVar7;
  uint functionId;
  undefined4 *puVar8;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  ulong uVar9;
  
  uVar6 = *(ushort *)&spilledRange->field_0x9c;
  if ((uVar6 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xb13,"(!spilledRange->isSpilled)","!spilledRange->isSpilled");
    if (!bVar5) goto LAB_00585d1b;
    *puVar8 = 0;
    uVar6 = *(ushort *)&spilledRange->field_0x9c;
  }
  reg = spilledRange->reg;
  uVar9 = (ulong)reg;
  this_00 = spilledRange->sym;
  *(ushort *)&spilledRange->field_0x9c = (uVar6 & 0xfbfe) + 1;
  spilledRange->reg = RegNOREG;
  if ((this_00->field_0x19 & 0x10) == 0) {
    bVar5 = StackSym::IsConst(this_00);
    if (bVar5) {
      bVar5 = IsSymNonTempLocalVar(this,this_00);
      if (!bVar5) goto LAB_00585a26;
    }
    AllocateStackSpace(this,spilledRange);
  }
LAB_00585a26:
  if ((spilledRange->field_0x9c & 8) == 0) {
    bVar5 = IsSymNonTempLocalVar(this,this_00);
    if (!bVar5) {
      InsertStores(this,spilledRange,reg,insertionInstr);
    }
    if (this->loopNest == 0) {
      bVar5 = StackSym::IsConst(this_00);
      if (bVar5) goto LAB_00585a69;
      SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear
                ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
                 ((long)this_00->scratch + 0x30));
    }
    else {
LAB_00585a69:
      InsertLoads(this,this_00,reg);
    }
    Lifetime::ApplyUseCountAdjust(spilledRange,this->curLoop);
  }
  if (uVar9 == 0) {
    if ((spilledRange->field_0x9d & 2) != 0) goto LAB_00585c29;
  }
  else {
    if ((spilledRange->reg != RegNOREG) && (this->regContent[uVar9] != spilledRange)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xb38,
                         "(reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange)"
                         ,
                         "reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange"
                        );
      if (!bVar5) goto LAB_00585d1b;
      *puVar8 = 0;
    }
    if ((spilledRange->field_0x9d & 2) != 0) {
      if (spilledRange->reg != RegNOREG) {
        if (this->regContent[uVar9] == spilledRange) {
          BVUnitT<unsigned_long>::AssertRange((uint)reg);
          if (((this->secondChanceRegs).word >> (uVar9 & 0x3f) & 1) != 0) goto LAB_00585c29;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xb3c,
                           "(reg == RegNOREG || spilledRange->reg == RegNOREG || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg)))"
                           ,
                           "reg == RegNOREG || spilledRange->reg == RegNOREG || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg))"
                          );
        if (!bVar5) goto LAB_00585d1b;
        *puVar8 = 0;
      }
LAB_00585c29:
      BVUnitT<unsigned_long>::AssertRange((uint)reg);
      (this->secondChanceRegs).word =
           (this->secondChanceRegs).word &
           (-2L << (reg & (RegXMM15|RegXMM14)) |
           0xfffffffffffffffeU >> 0x40 - (reg & (RegXMM15|RegXMM14)));
      spilledRange->field_0x9d = spilledRange->field_0x9d & 0xfd;
      goto LAB_00585c49;
    }
  }
  BVUnitT<unsigned_long>::AssertRange((uint)reg);
  if (((this->secondChanceRegs).word >> (uVar9 & 0x3f) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xb42,"(!this->secondChanceRegs.Test(reg))",
                       "!this->secondChanceRegs.Test(reg)");
    if (!bVar5) {
LAB_00585d1b:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
LAB_00585c49:
  this->regContent[reg] = (Lifetime *)0x0;
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,LinearScanPhase,uVar7,functionId);
  if (bVar5) {
    Output::Print(L"**** Spill: ");
    Sym::Dump(&this_00->super_Sym,(ValueType)0x9);
    Output::Print(L"(%S)",RegNames[reg]);
    uVar1 = spilledRange->end;
    uVar2 = spilledRange->useCount;
    uVar3 = spilledRange->start;
    uVar7 = GetSpillCost(this,spilledRange);
    Output::Print(L"  SpillCount:%d  Length:%d   Cost:%d\n",(ulong)uVar2,(ulong)(uVar1 - uVar3),
                  (ulong)uVar7);
  }
  return reg;
}

Assistant:

RegNum
LinearScan::SpillLiveRange(Lifetime * spilledRange, IR::Instr *insertionInstr)
{
    Assert(!spilledRange->isSpilled);

    RegNum reg = spilledRange->reg;
    StackSym *sym = spilledRange->sym;

    spilledRange->isSpilled = true;
    spilledRange->isCheapSpill = false;
    spilledRange->reg = RegNOREG;

    // Don't allocate stack space for const, we always reload them. (For debugm mode, allocate on the stack)
    if (!sym->IsAllocated() && (!sym->IsConst() || IsSymNonTempLocalVar(sym)))
    {
       this->AllocateStackSpace(spilledRange);
    }

    // No need to insert loads or stores if there are no uses.
    if (!spilledRange->isDeadStore)
    {
        // In the debug mode, don't do insertstore for this stacksym, as we want to retain the IsConst for the sym,
        // and later we are going to find the reg for it.
        if (!IsSymNonTempLocalVar(sym))
        {
            this->InsertStores(spilledRange, reg, insertionInstr);
        }

        if (this->IsInLoop() || sym->IsConst())
        {
            this->InsertLoads(sym, reg);
        }
        else
        {
            sym->scratch.linearScan.lifetime->useList.Clear();
        }
        // Adjust useCount in case of second chance allocation
        spilledRange->ApplyUseCountAdjust(this->curLoop);
    }

    Assert(reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange);
    if (spilledRange->isSecondChanceAllocated)
    {
        Assert(reg == RegNOREG || spilledRange->reg == RegNOREG
            || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg)));
        this->secondChanceRegs.Clear(reg);
        spilledRange->isSecondChanceAllocated = false;
    }
    else
    {
        Assert(!this->secondChanceRegs.Test(reg));
    }
    this->regContent[reg] = nullptr;

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        Output::Print(_u("**** Spill: "));
        sym->Dump();
        Output::Print(_u("(%S)"), RegNames[reg]);
        Output::Print(_u("  SpillCount:%d  Length:%d   Cost:%d\n"),
            spilledRange->useCount, spilledRange->end - spilledRange->start, this->GetSpillCost(spilledRange));
    }
#endif
    return reg;
}